

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

void __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_TestNLHandler3>::
ReadColumnSizes<true>
          (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_TestNLHandler3>
           *this)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ulong local_38 [2];
  ArgList local_28;
  
  iVar4 = (this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_vars;
  uVar3 = iVar4 - 1;
  uVar1 = BinaryReader<mp::internal::EndiannessConverter>::ReadUInt(this->reader_);
  if (uVar1 != uVar3) {
    local_38[0] = (ulong)uVar3;
    local_28.types_ = 2;
    local_28.field_1.values_ = (Value *)local_38;
    BinaryReaderBase::ReportError
              (&this->reader_->super_BinaryReaderBase,(CStringRef)0x26c0f9,&local_28);
  }
  if (1 < iVar4) {
    iVar4 = 0;
    do {
      iVar2 = BinaryReader<mp::internal::EndiannessConverter>::ReadUInt(this->reader_);
      if (iVar2 < iVar4) {
        local_38[0] = 0;
        local_38[1] = 0;
        local_28.types_ = 0;
        local_28.field_1.values_ = (Value *)local_38;
        BinaryReaderBase::ReportError
                  (&this->reader_->super_BinaryReaderBase,(CStringRef)0x2676ca,&local_28);
      }
      uVar3 = uVar3 - 1;
      iVar4 = iVar2;
    } while (uVar3 != 0);
  }
  return;
}

Assistant:

void NLReader<Reader, Handler>::ReadColumnSizes() {
  int num_sizes = header_.num_vars - 1;
  if (reader_.ReadUInt() != num_sizes)
    reader_.ReportError("expected {}", num_sizes);
  reader_.ReadTillEndOfLine();
  typename Handler::ColumnSizeHandler size_handler = handler_.OnColumnSizes();
  int prev_size = 0;
  for (int i = 0; i < num_sizes; ++i) {
    int size = reader_.ReadUInt();
    if (CUMULATIVE) {
      if (size < prev_size)
        reader_.ReportError("invalid column offset");
      size -= prev_size;
      prev_size += size;
    }
    size_handler.Add(size);
    reader_.ReadTillEndOfLine();
  }
}